

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLinePositionSpan.h
# Opt level: O0

void __thiscall
psy::FileLinePositionSpan::FileLinePositionSpan
          (FileLinePositionSpan *this,FileLinePositionSpan *param_1)

{
  FileLinePositionSpan *param_1_local;
  FileLinePositionSpan *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  (this->span_).start_ = (param_1->span_).start_;
  (this->span_).end_ = (param_1->span_).end_;
  return;
}

Assistant:

class PSY_API FileLinePositionSpan
{
public:
    FileLinePositionSpan(std::string path, LinePositionSpan span)
        : path_(std::move(path))
        , span_(std::move(span))
    {}

    FileLinePositionSpan(std::string path,
                         const LinePosition& start,
                         const LinePosition& end)
        : path_(std::move(path))
        , span_(start, end)
    {}

    /**
     * The path of the file.
     */
    std::string path() const { return path_; }

    /**
     * The line span within the file.
     */
    LinePositionSpan span() const { return span_; }

    /**
     * The line position of the end of the span.
     */
    LinePosition endLinePosition() const { return span_.end(); }

    /**
     * The line position of the start of the span.
     */
    LinePosition starLinePosition() const { return span_.start(); }

private:
    std::string path_;
    LinePositionSpan span_;
}